

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleFileIndexedStorage.hpp
# Opt level: O1

InputIterator<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_14UL,_void>
 __thiscall
supermap::
SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
::getDataIterator(SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
                  *this)

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  unsigned_long extraout_RDX;
  unsigned_long extraout_RDX_00;
  unsigned_long extraout_RDX_01;
  unsigned_long uVar2;
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>,unsigned_long,void>
  *in_RSI;
  InputIterator<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_14UL,_void>
  IVar3;
  _func_int **local_70;
  string local_68;
  path local_48;
  
  puVar1 = *(undefined8 **)(*(long *)(in_RSI + 0x20) + 0x20);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)(in_RSI + 0x20) + 0x28);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  SingleFileIndexedStorage<supermap::KeyValue<supermap::Key<4ul>,supermap::ByteArray<10ul>>,unsigned_long,void>
  ::getStorageFilePath_abi_cxx11_(&local_68,in_RSI);
  std::filesystem::__cxx11::path::path(&local_48,&local_68,auto_format);
  (**(code **)*puVar1)(&local_70,puVar1,&local_48,0);
  (this->
  super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
  ).
  super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
  ._vptr_OrderedStorage = local_70;
  local_70 = (_func_int **)0x0;
  (this->
  super_IndexedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
  ).
  super_OrderedStorage<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_unsigned_long,_void>
  .register_.
  super_StorageItemRegister<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>
  .
  super_Cloneable<supermap::StorageItemRegister<supermap::KeyValue<supermap::Key<4UL>,_supermap::ByteArray<10UL>_>,_supermap::CountingStorageInfo<unsigned_long,_void>_>_>
  ._vptr_Cloneable = (_func_int **)0x0;
  std::filesystem::__cxx11::path::~path(&local_48);
  uVar2 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    uVar2 = extraout_RDX_00;
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    uVar2 = extraout_RDX_01;
  }
  IVar3.index_ = uVar2;
  IVar3.input_._M_t.
  super___uniq_ptr_impl<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>_>.
  _M_t.
  super__Tuple_impl<0UL,_supermap::io::InputStream_*,_std::default_delete<supermap::io::InputStream>_>
  .super__Head_base<0UL,_supermap::io::InputStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
        )(__uniq_ptr_data<supermap::io::InputStream,_std::default_delete<supermap::io::InputStream>,_true,_true>
          )this;
  return IVar3;
}

Assistant:

io::InputIterator<T, IndexT> getDataIterator() const {
        return getFileManager()->template getInputIterator<T, IndexT>(getStorageFilePath(), 0);
    }